

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O1

char * __thiscall Indexer::index(Indexer *this,char *__s,int __c)

{
  bool bVar1;
  ulong bytes;
  char *pcVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  DatasetBuilder *this_00;
  path local_60;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__s);
  bytes = std::experimental::filesystem::v1::file_size(&local_60);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_60);
  this_00 = &this->flat_builder;
  if (0x1400000 < bytes) {
    this_00 = &this->bitmap_builder;
  }
  bVar1 = DatasetBuilder::can_still_add(this_00,bytes);
  __c_00 = extraout_EDX;
  if (!bVar1) {
    make_spill(this,this_00);
    __c_00 = extraout_EDX_00;
  }
  pcVar2 = DatasetBuilder::index(this_00,__s,__c_00);
  return pcVar2;
}

Assistant:

void Indexer::index(const std::string &target) {
    DatasetBuilder *builder = &flat_builder;

    try {
        uint64_t file_size = fs::file_size(target);

        if (file_size > 1024 * 1024 * 20) {
            builder = &bitmap_builder;
        }

        if (!builder->can_still_add(file_size)) {
            make_spill(*builder);
        }

        builder->index(target);
    } catch (empty_file_error &e) {
        spdlog::debug("Empty file (skip): {}", target);
    } catch (file_open_error &e) {
        spdlog::warn("Failed to open {} reason: {}", target, e.what());
    } catch (invalid_filename_error &e) {
        spdlog::warn("Illegal file name (skip): {}", target);
    }
}